

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_fnmatch(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  uint uVar1;
  int iVar2;
  u8 *zPattern;
  u8 *zString;
  
  iVar2 = 0;
  if (((1 < nArg) && (((*apArg)->iFlags & 1) != 0)) && (iVar2 = 0, (apArg[1]->iFlags & 1) != 0)) {
    zPattern = (u8 *)jx9_value_to_string(*apArg,(int *)0x0);
    zString = (u8 *)jx9_value_to_string(apArg[1],(int *)0x0);
    iVar2 = 0x5c;
    uVar1 = 0;
    if ((nArg != 2) && (uVar1 = 0, (apArg[2]->iFlags & 2) != 0)) {
      uVar1 = jx9_value_to_int(apArg[2]);
      iVar2 = 0x5c;
      if ((uVar1 & 1) != 0) {
        iVar2 = 0;
      }
      uVar1 = uVar1 >> 3 & 1;
    }
    iVar2 = patternCompare(zPattern,zString,iVar2,uVar1);
  }
  jx9_result_bool(pCtx,iVar2);
  return 0;
}

Assistant:

static int jx9Builtin_fnmatch(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zString, *zPattern;
	int iEsc = '\\';
	int noCase = 0;
	int rc;
	if( nArg < 2 || !jx9_value_is_string(apArg[0]) || !jx9_value_is_string(apArg[1]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the pattern and the string */
	zPattern  = jx9_value_to_string(apArg[0], 0);
	zString = jx9_value_to_string(apArg[1], 0);
	/* Extract the flags if avaialble */
	if( nArg > 2 && jx9_value_is_int(apArg[2]) ){
		rc = jx9_value_to_int(apArg[2]);
		if( rc & 0x01 /*FNM_NOESCAPE*/){
			iEsc = 0;
		}
		if( rc & 0x08 /*FNM_CASEFOLD*/){
			noCase = 1;
		}
	}
	/* Go globbing */
	rc = Glob((const unsigned char *)zPattern, (const unsigned char *)zString, iEsc, noCase);
	/* Globbing result */
	jx9_result_bool(pCtx, rc);
	return JX9_OK;
}